

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Areal_Object_State_PDU::AddPoint(Areal_Object_State_PDU *this,WorldCoordinates *P)

{
  WorldCoordinates *P_local;
  Areal_Object_State_PDU *this_local;
  
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_Object_State_Header).super_Header.super_Header6.m_ui16PDULength + 0x18;
  std::vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
  ::push_back(&this->m_vPoints,P);
  this->m_ui16NumPoints = this->m_ui16NumPoints + 1;
  return;
}

Assistant:

void Areal_Object_State_PDU::AddPoint( const WorldCoordinates & P )
{
    m_ui16PDULength += WorldCoordinates::WORLD_COORDINATES_SIZE;
    m_vPoints.push_back( P );
    ++m_ui16NumPoints;
}